

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[7],char[7],char>(JObject *this,char (*k) [7],char (*v) [7],char *c)

{
  ostream *os;
  JSON<pstack::Field<char[7],_char[7]>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[7],_char[7]> field;
  char *c_local;
  char (*v_local) [7];
  char (*k_local) [7];
  JObject *this_local;
  
  field.v = (char (*) [7])c;
  Field<char[7],_char[7]>::Field((Field<char[7],_char[7]> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[7],char[7]>,char>((Field<char[7],_char[7]> *)local_38,*field.v)
  ;
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }